

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

Terminator * __thiscall soul::ModuleCloner::cloneTerminator(ModuleCloner *this,Terminator *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  PoolItem *pPVar4;
  undefined4 extraout_var_01;
  void *in_R8;
  undefined1 auVar5 [16];
  void **ppvVar2;
  
  iVar1 = 0;
  auVar5 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::Branch::typeinfo);
  if (auVar5._0_8_ == (__fn *)0x0) {
    iVar1 = 0;
    auVar5 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::BranchIf::typeinfo);
    if (auVar5._0_8_ == (__fn *)0x0) {
      lVar3 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnVoid::typeinfo);
      if (lVar3 == 0) {
        iVar1 = 0;
        auVar5 = __dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnValue::typeinfo);
        if (auVar5._0_8_ == (__fn *)0x0) {
          throwInternalCompilerError("cloneTerminator",0x149);
        }
        iVar1 = clone(this,auVar5._0_8_,auVar5._8_8_,iVar1,in_R8);
        ppvVar2 = (void **)CONCAT44(extraout_var_01,iVar1);
      }
      else {
        pPVar4 = PoolAllocator::allocateSpaceForObject(&this->newModule->allocator->pool,0x18);
        ppvVar2 = &pPVar4->item;
        pPVar4->item = (void *)0x0;
        *(undefined8 *)&pPVar4->field_0x18 = 0;
        pPVar4[1].size = 0;
        pPVar4->item = &PTR__Object_002d9798;
        pPVar4->destructor =
             PoolAllocator::allocate<soul::heart::ReturnVoid>::anon_class_1_0_00000001::__invoke;
      }
    }
    else {
      iVar1 = clone(this,auVar5._0_8_,auVar5._8_8_,iVar1,in_R8);
      ppvVar2 = (void **)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    iVar1 = clone(this,auVar5._0_8_,auVar5._8_8_,iVar1,in_R8);
    ppvVar2 = (void **)CONCAT44(extraout_var,iVar1);
  }
  return (Terminator *)ppvVar2;
}

Assistant:

heart::Terminator& cloneTerminator (heart::Terminator& s)
    {
        #define SOUL_CLONE_TERMINATOR(Type)    if (auto t = cast<const heart::Type> (s)) return clone (*t);
        SOUL_HEART_TERMINATORS (SOUL_CLONE_TERMINATOR)
        #undef SOUL_CLONE_TERMINATOR
        SOUL_ASSERT_FALSE;
        return s;
    }